

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c++
# Opt level: O0

ssize_t __thiscall
kj::anon_unknown_36::HttpClientAdapter::WebSocketResponseImpl::send
          (WebSocketResponseImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  SourceLocation location;
  unsigned_long *puVar1;
  String *pSVar2;
  Own<kj::HttpHeaders,_std::nullptr_t> *pOVar3;
  Own<kj::AsyncInputStream,_std::nullptr_t> *params;
  PromiseFulfiller<kj::HttpClient::WebSocketResponse> *pPVar4;
  Own<kj::AsyncOutputStream,_std::nullptr_t> *other;
  void *__child_stack;
  undefined4 in_register_00000034;
  WebSocketResponseImpl *object;
  undefined4 in_register_00000084;
  char *__arg;
  __fn *in_R9;
  Maybe<unsigned_long> *in_stack_00000008;
  Own<kj::AsyncInputStream,_std::nullptr_t> local_220;
  undefined1 local_210 [56];
  undefined1 local_1d8 [40];
  undefined1 local_1b0 [8];
  Own<kj::AsyncInputStream,_std::nullptr_t> wrapper;
  undefined1 local_190 [8];
  OneWayPipe pipe;
  Own<kj::NullStream,_std::nullptr_t> local_168;
  undefined1 local_150 [32];
  _lambda___1_ local_130 [16];
  String local_120;
  Own<kj::HttpHeaders,_std::nullptr_t> local_108;
  Maybe<unsigned_long> local_f8;
  Promise<void> local_e8;
  Promise<void> local_e0;
  unsigned_long local_d8 [3];
  HttpHeaders local_c0;
  undefined1 local_60 [8];
  Own<kj::HttpHeaders,_std::nullptr_t> headersCopy;
  String statusTextCopy;
  HttpHeaders *headers_local;
  uint statusCode_local;
  WebSocketResponseImpl *this_local;
  StringPtr statusText_local;
  
  __arg = (char *)CONCAT44(in_register_00000084,__flags);
  object = (WebSocketResponseImpl *)CONCAT44(in_register_00000034,__fd);
  this_local = (WebSocketResponseImpl *)__n;
  statusText_local.content.ptr = __arg;
  statusText_local.content.size_ = (size_t)this;
  str<kj::StringPtr&>((String *)&headersCopy.ptr,(kj *)&this_local,(StringPtr *)__buf);
  HttpHeaders::clone(&local_c0,in_R9,__child_stack,(int)__n,__arg);
  heap<kj::HttpHeaders>((kj *)local_60,&local_c0);
  HttpHeaders::~HttpHeaders(&local_c0);
  local_d8[0] = 1;
  puVar1 = Maybe<unsigned_long>::orDefault(in_stack_00000008,local_d8);
  if (*puVar1 == 0) {
    local_130._0_8_ = object;
    local_130._8_4_ = (uint)__buf;
    pSVar2 = mv<kj::String>((String *)&headersCopy.ptr);
    String::String(&local_120,pSVar2);
    pOVar3 = mv<kj::Own<kj::HttpHeaders,decltype(nullptr)>>
                       ((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
    Own<kj::HttpHeaders,_std::nullptr_t>::Own(&local_108,pOVar3);
    Maybe<unsigned_long>::Maybe(&local_f8,in_stack_00000008);
    Promise<void>::
    then<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda()_1_>
              (&local_e8,(Type *)&object->task);
    SourceLocation::SourceLocation
              ((SourceLocation *)local_150,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/compat/http.c++"
               ,"send",0x1b8e,0x10);
    location.function = (char *)local_150._8_8_;
    location.fileName = (char *)local_150._0_8_;
    location.lineNumber = local_150._16_4_;
    location.columnNumber = local_150._20_4_;
    Promise<void>::
    eagerlyEvaluate<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::_lambda(kj::Exception&&)_1_>
              (&local_e0,(Type *)&local_e8,location);
    Promise<void>::operator=(&object->task,&local_e0);
    Promise<void>::~Promise(&local_e0);
    Promise<void>::~Promise(&local_e8);
    (anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl::
    send(unsigned_int,kj::StringPtr,kj::HttpHeaders_const&,kj::Maybe<unsigned_long>)::{lambda()#1}::
    ~Maybe(local_130);
    heap<kj::NullStream>();
    Own<kj::AsyncOutputStream,decltype(nullptr)>::Own<kj::NullStream,void>
              ((Own<kj::AsyncOutputStream,decltype(nullptr)> *)this,&local_168);
    Own<kj::NullStream,_std::nullptr_t>::~Own(&local_168);
    pipe.out.ptr._4_4_ = 1;
  }
  else {
    Maybe<unsigned_long>::Maybe((Maybe<unsigned_long> *)&wrapper.ptr,in_stack_00000008);
    newOneWayPipe((OneWayPipe *)local_190,(Maybe<unsigned_long> *)&wrapper.ptr);
    Maybe<unsigned_long>::~Maybe((Maybe<unsigned_long> *)&wrapper.ptr);
    params = mv<kj::Own<kj::AsyncInputStream,decltype(nullptr)>>
                       ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_190);
    addRef<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl>
              ((kj *)local_1d8,object);
    Promise<void>::
    attach<kj::Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,decltype(nullptr)>>
              ((Promise<void> *)(local_1d8 + 0x10),
               (Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
                *)&object->task);
    heap<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::Promise<void>>
              ((kj *)(local_1d8 + 0x18),params,(Promise<void> *)(local_1d8 + 0x10));
    Own<kj::AsyncInputStream,decltype(nullptr)>::
    Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,void>
              ((Own<kj::AsyncInputStream,decltype(nullptr)> *)local_1b0,
               (Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,_std::nullptr_t>
                *)(local_1d8 + 0x18));
    Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::HttpClientAdapter::DelayedEofInputStream,_std::nullptr_t>
                *)(local_1d8 + 0x18));
    Promise<void>::~Promise((Promise<void> *)(local_1d8 + 0x10));
    Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>::~Own
              ((Own<kj::(anonymous_namespace)::HttpClientAdapter::WebSocketResponseImpl,_std::nullptr_t>
                *)local_1d8);
    pPVar4 = Own<kj::PromiseFulfiller<kj::HttpClient::WebSocketResponse>,_std::nullptr_t>::
             operator->(&object->fulfiller);
    local_210._0_4_ = (uint)__buf;
    StringPtr::StringPtr((StringPtr *)(local_210 + 8),(String *)&headersCopy.ptr);
    local_210._24_8_ =
         Own<kj::HttpHeaders,_std::nullptr_t>::get((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60)
    ;
    pOVar3 = (Own<kj::HttpHeaders,_std::nullptr_t> *)mv<kj::String>((String *)&headersCopy.ptr);
    mv<kj::Own<kj::HttpHeaders,decltype(nullptr)>>((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60)
    ;
    Own<kj::AsyncInputStream,decltype(nullptr)>::
    attach<kj::String,kj::Own<kj::HttpHeaders,decltype(nullptr)>>
              ((Own<kj::AsyncInputStream,decltype(nullptr)> *)&local_220,(String *)local_1b0,pOVar3)
    ;
    OneOf<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::Own<kj::WebSocket,decltype(nullptr)>>
    ::OneOf<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,int>
              ((OneOf<kj::Own<kj::AsyncInputStream,decltype(nullptr)>,kj::Own<kj::WebSocket,decltype(nullptr)>>
                *)(local_210 + 0x20),&local_220);
    (*(pPVar4->super_PromiseRejector)._vptr_PromiseRejector[2])(pPVar4,local_210);
    HttpClient::WebSocketResponse::~WebSocketResponse((WebSocketResponse *)local_210);
    Own<kj::AsyncInputStream,_std::nullptr_t>::~Own(&local_220);
    other = mv<kj::Own<kj::AsyncOutputStream,decltype(nullptr)>>
                      ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)&pipe.in.ptr);
    Own<kj::AsyncOutputStream,_std::nullptr_t>::Own
              ((Own<kj::AsyncOutputStream,_std::nullptr_t> *)this,other);
    pipe.out.ptr._4_4_ = 1;
    Own<kj::AsyncInputStream,_std::nullptr_t>::~Own
              ((Own<kj::AsyncInputStream,_std::nullptr_t> *)local_1b0);
    OneWayPipe::~OneWayPipe((OneWayPipe *)local_190);
  }
  Own<kj::HttpHeaders,_std::nullptr_t>::~Own((Own<kj::HttpHeaders,_std::nullptr_t> *)local_60);
  String::~String((String *)&headersCopy.ptr);
  return (ssize_t)this;
}

Assistant:

kj::Own<kj::AsyncOutputStream> send(
        uint statusCode, kj::StringPtr statusText, const HttpHeaders& headers,
        kj::Maybe<uint64_t> expectedBodySize = kj::none) override {
      // The caller of HttpClient is allowed to assume that the statusText and headers remain
      // valid until the body stream is dropped, but the HttpService implementation is allowed to
      // send values that are only valid until send() returns, so we have to copy.
      auto statusTextCopy = kj::str(statusText);
      auto headersCopy = kj::heap(headers.clone());

      if (expectedBodySize.orDefault(1) == 0) {
        // We're not expecting any body. We need to delay reporting completion to the client until
        // the server side has actually returned from the service method, otherwise we may
        // prematurely cancel it.

        task = task.then([this,statusCode,statusTextCopy=kj::mv(statusTextCopy),
                          headersCopy=kj::mv(headersCopy),expectedBodySize]() mutable {
          fulfiller->fulfill({
            statusCode, statusTextCopy, headersCopy.get(),
            kj::Own<AsyncInputStream>(kj::heap<HeadResponseStream>(expectedBodySize)
                .attach(kj::mv(statusTextCopy), kj::mv(headersCopy)))
          });
        }).eagerlyEvaluate([](kj::Exception&& e) { KJ_LOG(ERROR, e); });
        return kj::heap<kj::NullStream>();
      } else {
        auto pipe = newOneWayPipe(expectedBodySize);

        // Wrap the stream in a wrapper that delays the last read (the one that signals EOF) until
        // the service's request promise has finished.
        kj::Own<AsyncInputStream> wrapper =
            kj::heap<DelayedEofInputStream>(kj::mv(pipe.in), task.attach(kj::addRef(*this)));

        fulfiller->fulfill({
          statusCode, statusTextCopy, headersCopy.get(),
          wrapper.attach(kj::mv(statusTextCopy), kj::mv(headersCopy))
        });
        return kj::mv(pipe.out);
      }
    }